

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

int __thiscall jpgd::jpeg_decoder::begin_decoding(jpeg_decoder *this)

{
  int iVar1;
  jpeg_decoder *this_local;
  
  if ((this->m_ready_flag & 1U) == 0) {
    if (this->m_error_code == JPGD_SUCCESS) {
      iVar1 = _setjmp((__jmp_buf_tag *)this);
      if (iVar1 == 0) {
        decode_start(this);
        this->m_ready_flag = true;
        this_local._4_4_ = 0;
      }
      else {
        this_local._4_4_ = -1;
      }
    }
    else {
      this_local._4_4_ = -1;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int jpeg_decoder::begin_decoding()
	{
		if (m_ready_flag)
			return JPGD_SUCCESS;

		if (m_error_code)
			return JPGD_FAILED;

		if (::setjmp(m_jmp_state))
			return JPGD_FAILED;

		decode_start();

		m_ready_flag = true;

		return JPGD_SUCCESS;
	}